

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_base_func.cpp
# Opt level: O2

uint32_t ivk::cmd_set_ret(void *el)

{
  uint in_EAX;
  XMLError XVar1;
  uint32_t uVar2;
  ulong uStack_8;
  int ret;
  
  if (el != (void *)0x0) {
    uStack_8 = (ulong)in_EAX;
    XVar1 = tinyxml2::XMLElement::QueryIntAttribute(*el,"value",&ret);
    if (XVar1 == XML_NO_ERROR) {
      uVar2 = setret(ret);
    }
    else {
      uVar2 = 5;
    }
    return uVar2;
  }
  return 2;
}

Assistant:

uint32_t ivk::cmd_set_ret(void *el) {
    if(!el){
        return proc_param_err;
    }
    XMLElement** ppEl = (XMLElement**)el;
    XMLElement* pEl = *ppEl;
    int ret=0;
    XMLError er = pEl->QueryIntAttribute("value",&ret);
    if(er!=XML_NO_ERROR){
        return proc_xml_err;
    }

    return ivk::setret((uint32_t)ret);
}